

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

picnic_params_t_conflict argument_to_params(char *arg)

{
  char cVar1;
  picnic_params_t parameters;
  size_type sVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  size_type sVar7;
  long lVar8;
  bool bVar9;
  uint idx;
  ulong local_1f0;
  picnic_params_t local_1e4;
  long local_1e0;
  pointer local_1d8;
  string sarg;
  istringstream iss;
  size_type local_1a8;
  byte abStack_190 [352];
  
  local_1f0 = std::__cxx11::string::string((string *)&sarg,arg,(allocator *)&iss);
  lVar8 = 0;
  do {
    if (lVar8 == 0x30) {
      std::__cxx11::istringstream::istringstream((istringstream *)&iss,(string *)&sarg,_S_in);
      std::istream::_M_extract<unsigned_int>((uint *)&iss);
      local_1f0 = (ulong)idx;
      if (idx - 0xd < 0xfffffff4) {
        local_1f0 = 0;
      }
      if ((abStack_190[*(long *)(_iss + -0x18)] & 5) != 0) {
        local_1f0 = 0;
      }
      std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
      break;
    }
    parameters = *(picnic_params_t *)((long)&(anonymous_namespace)::all_parameters + lVar8);
    pcVar6 = picnic_get_param_name(parameters);
    std::__cxx11::string::string((string *)&iss,pcVar6,(allocator *)&idx);
    lVar3 = _iss;
    sVar2 = sarg._M_string_length;
    if (sarg._M_string_length == local_1a8) {
      local_1d8 = sarg._M_dataplus._M_p;
      local_1e4 = parameters;
      local_1e0 = lVar8;
      for (sVar7 = 0; bVar9 = sVar2 == sVar7, !bVar9; sVar7 = sVar7 + 1) {
        cVar1 = *(char *)(lVar3 + sVar7);
        iVar4 = tolower((int)local_1d8[sVar7]);
        iVar5 = tolower((int)cVar1);
        lVar8 = local_1e0;
        if (iVar4 != iVar5) goto LAB_0010d1c8;
      }
      local_1f0 = (ulong)local_1e4;
      lVar8 = local_1e0;
    }
    else {
      bVar9 = false;
    }
LAB_0010d1c8:
    std::__cxx11::string::~string((string *)&iss);
    lVar8 = lVar8 + 4;
  } while (!bVar9);
  std::__cxx11::string::~string((string *)&sarg);
  return (picnic_params_t_conflict)local_1f0;
}

Assistant:

picnic_params_t argument_to_params(const char* arg) {
  const std::string sarg{arg};

  for (const auto param : all_parameters) {
    const std::string name{picnic_get_param_name(param)};
    if (isequal(sarg, name)) {
      return param;
    }
  }

  std::istringstream iss{sarg};
  unsigned int idx;
  iss >> idx;
  if (!iss || idx == PARAMETER_SET_INVALID || idx >= PARAMETER_SET_MAX_INDEX) {
    return PARAMETER_SET_INVALID;
  }

  return static_cast<picnic_params_t>(idx);
}